

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O0

spv_result_t spvtools::val::AnnotationPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpDecorate) {
    sVar2 = anon_unknown_4::ValidateDecorate(_,inst);
  }
  else if (OVar1 == OpMemberDecorate) {
    sVar2 = anon_unknown_4::ValidateMemberDecorate(_,inst);
  }
  else if (OVar1 == OpDecorationGroup) {
    sVar2 = anon_unknown_4::ValidateDecorationGroup(_,inst);
  }
  else if (OVar1 == OpGroupDecorate) {
    sVar2 = anon_unknown_4::ValidateGroupDecorate(_,inst);
  }
  else if (OVar1 == OpGroupMemberDecorate) {
    sVar2 = anon_unknown_4::ValidateGroupMemberDecorate(_,inst);
  }
  else {
    if (OVar1 != OpDecorateId) goto LAB_00aa2f0a;
    sVar2 = anon_unknown_4::ValidateDecorateId(_,inst);
  }
  if (sVar2 != SPV_SUCCESS) {
    return sVar2;
  }
LAB_00aa2f0a:
  anon_unknown_4::RegisterDecorations(_,inst);
  return SPV_SUCCESS;
}

Assistant:

spv_result_t AnnotationPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpDecorate:
      if (auto error = ValidateDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorateId:
      if (auto error = ValidateDecorateId(_, inst)) return error;
      break;
    // TODO(dneto): spv::Op::OpDecorateStringGOOGLE
    // See https://github.com/KhronosGroup/SPIRV-Tools/issues/2253
    case spv::Op::OpMemberDecorate:
      if (auto error = ValidateMemberDecorate(_, inst)) return error;
      break;
    case spv::Op::OpDecorationGroup:
      if (auto error = ValidateDecorationGroup(_, inst)) return error;
      break;
    case spv::Op::OpGroupDecorate:
      if (auto error = ValidateGroupDecorate(_, inst)) return error;
      break;
    case spv::Op::OpGroupMemberDecorate:
      if (auto error = ValidateGroupMemberDecorate(_, inst)) return error;
      break;
    default:
      break;
  }

  // In order to validate decoration rules, we need to know all the decorations
  // that are applied to any given <id>.
  RegisterDecorations(_, inst);

  return SPV_SUCCESS;
}